

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O0

int IBBDDQJac(IBBDPrecData pdata,sunrealtype tt,sunrealtype cj,N_Vector yy,N_Vector yp,N_Vector gref
             ,N_Vector ytemp,N_Vector yptemp,N_Vector gtemp)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *psVar13;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined8 in_stack_00000008;
  sunrealtype ewtj;
  sunrealtype ypj;
  sunrealtype yj;
  sunrealtype conj;
  sunrealtype *col_j;
  sunrealtype *ewtdata;
  sunrealtype *cnsdata;
  sunrealtype *gtempdata;
  sunrealtype *grefdata;
  sunrealtype *yptempdata;
  sunrealtype *ytempdata;
  sunrealtype *ypdata;
  sunrealtype *ydata;
  sunindextype i2;
  sunindextype i1;
  sunindextype ngroups;
  sunindextype width;
  sunindextype j;
  sunindextype i;
  sunindextype group;
  int retval;
  sunrealtype inc_inv;
  sunrealtype inc;
  IDAMem IDA_mem;
  long local_170;
  long local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_138;
  double local_130;
  double local_128;
  long local_110;
  long local_d8;
  long local_80;
  long local_78;
  long local_70;
  double local_58;
  int local_4;
  
  local_d8 = 0;
  lVar3 = in_RDI[0x13];
  N_VScale(0x3ff0000000000000,in_RSI,in_R8);
  N_VScale(0x3ff0000000000000,in_RDX,in_R9);
  lVar5 = N_VGetArrayPointer(in_RSI);
  lVar6 = N_VGetArrayPointer(in_RDX);
  lVar7 = N_VGetArrayPointer(in_stack_00000008);
  lVar8 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x278));
  if (*(int *)(lVar3 + 0x58) != 0) {
    local_d8 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x2b0));
  }
  lVar9 = N_VGetArrayPointer(in_R8);
  lVar10 = N_VGetArrayPointer(in_R9);
  lVar11 = N_VGetArrayPointer(in_RCX);
  if ((in_RDI[6] == 0) ||
     (local_4 = (*(code *)in_RDI[6])
                          (in_XMM0_Qa,in_RDI[7],in_RSI,in_RDX,*(undefined8 *)(lVar3 + 0x18)),
     local_4 == 0)) {
    local_4 = (*(code *)in_RDI[5])
                        (in_XMM0_Qa,in_RDI[7],in_RSI,in_RDX,in_RCX,*(undefined8 *)(lVar3 + 0x18));
    in_RDI[0x12] = in_RDI[0x12] + 1;
    if (local_4 == 0) {
      lVar12 = in_RDI[1] + *in_RDI + 1;
      local_110 = lVar12;
      if (in_RDI[7] <= lVar12) {
        local_110 = in_RDI[7];
      }
      for (local_70 = 1; local_70 <= local_110; local_70 = local_70 + 1) {
        for (local_80 = local_70 + -1; local_80 < in_RDI[7]; local_80 = lVar12 + local_80) {
          dVar1 = *(double *)(lVar5 + local_80 * 8);
          dVar2 = *(double *)(lVar6 + local_80 * 8);
          local_138 = *(double *)(lVar8 + local_80 * 8);
          if (ABS(*(double *)(lVar3 + 0x4e0) * dVar2) <= 1.0 / local_138) {
            local_128 = 1.0 / local_138;
          }
          else {
            local_128 = ABS(*(double *)(lVar3 + 0x4e0) * dVar2);
          }
          if (ABS(dVar1) <= local_128) {
            if (ABS(*(double *)(lVar3 + 0x4e0) * dVar2) <= 1.0 / local_138) {
              local_138 = 1.0 / local_138;
            }
            else {
              local_138 = ABS(*(double *)(lVar3 + 0x4e0) * dVar2);
            }
            local_130 = local_138;
          }
          else {
            local_130 = ABS(dVar1);
          }
          local_58 = (double)in_RDI[4] * local_130;
          if (*(double *)(lVar3 + 0x4e0) * dVar2 < 0.0) {
            local_58 = -local_58;
          }
          local_58 = (dVar1 + local_58) - dVar1;
          if (*(int *)(lVar3 + 0x58) != 0) {
            dVar2 = *(double *)(local_d8 + local_80 * 8);
            if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
              if ((ABS(dVar2) == 2.0) && ((!NAN(ABS(dVar2)) && ((dVar1 + local_58) * dVar2 <= 0.0)))
                 ) {
                local_58 = -local_58;
              }
            }
            else if ((dVar1 + local_58) * dVar2 < 0.0) {
              local_58 = -local_58;
            }
          }
          *(double *)(lVar9 + local_80 * 8) = local_58 + *(double *)(lVar9 + local_80 * 8);
          *(double *)(lVar10 + local_80 * 8) =
               (double)CONCAT44(in_XMM1_Db,in_XMM1_Da) * local_58 +
               *(double *)(lVar10 + local_80 * 8);
        }
        iVar4 = (*(code *)in_RDI[5])
                          (in_XMM0_Qa,in_RDI[7],in_R8,in_R9,in_stack_00000008,
                           *(undefined8 *)(lVar3 + 0x18));
        in_RDI[0x12] = in_RDI[0x12] + 1;
        if (iVar4 != 0) {
          return iVar4;
        }
        for (local_80 = local_70 + -1; local_80 < in_RDI[7]; local_80 = lVar12 + local_80) {
          dVar1 = *(double *)(lVar5 + local_80 * 8);
          *(double *)(lVar9 + local_80 * 8) = dVar1;
          dVar2 = *(double *)(lVar6 + local_80 * 8);
          *(double *)(lVar10 + local_80 * 8) = dVar2;
          local_160 = *(double *)(lVar8 + local_80 * 8);
          if (ABS(*(double *)(lVar3 + 0x4e0) * dVar2) <= 1.0 / local_160) {
            local_150 = 1.0 / local_160;
          }
          else {
            local_150 = ABS(*(double *)(lVar3 + 0x4e0) * dVar2);
          }
          if (ABS(dVar1) <= local_150) {
            if (ABS(*(double *)(lVar3 + 0x4e0) * dVar2) <= 1.0 / local_160) {
              local_160 = 1.0 / local_160;
            }
            else {
              local_160 = ABS(*(double *)(lVar3 + 0x4e0) * dVar2);
            }
            local_158 = local_160;
          }
          else {
            local_158 = ABS(dVar1);
          }
          local_58 = (double)in_RDI[4] * local_158;
          if (*(double *)(lVar3 + 0x4e0) * dVar2 < 0.0) {
            local_58 = -local_58;
          }
          local_58 = (dVar1 + local_58) - dVar1;
          if (*(int *)(lVar3 + 0x58) != 0) {
            dVar2 = *(double *)(local_d8 + local_80 * 8);
            if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
              if ((ABS(dVar2) == 2.0) && ((!NAN(ABS(dVar2)) && ((dVar1 + local_58) * dVar2 <= 0.0)))
                 ) {
                local_58 = -local_58;
              }
            }
            else if ((dVar1 + local_58) * dVar2 < 0.0) {
              local_58 = -local_58;
            }
          }
          psVar13 = SUNBandMatrix_Column((SUNMatrix)in_RDI[8],local_80);
          if (local_80 - in_RDI[2] < 0) {
            local_168 = 0;
          }
          else {
            local_168 = local_80 - in_RDI[2];
          }
          if (local_80 + in_RDI[3] < in_RDI[7] + -1) {
            local_170 = local_80 + in_RDI[3];
          }
          else {
            local_170 = in_RDI[7] + -1;
          }
          for (local_78 = local_168; local_78 <= local_170; local_78 = local_78 + 1) {
            psVar13[local_78 - local_80] =
                 (1.0 / local_58) *
                 (*(double *)(lVar7 + local_78 * 8) - *(double *)(lVar11 + local_78 * 8));
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int IBBDDQJac(IBBDPrecData pdata, sunrealtype tt, sunrealtype cj,
                     N_Vector yy, N_Vector yp, N_Vector gref, N_Vector ytemp,
                     N_Vector yptemp, N_Vector gtemp)
{
  IDAMem IDA_mem;
  sunrealtype inc, inc_inv;
  int retval;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunrealtype *ydata, *ypdata, *ytempdata, *yptempdata, *grefdata, *gtempdata;
  sunrealtype *cnsdata = NULL, *ewtdata;
  sunrealtype *col_j, conj, yj, ypj, ewtj;

  IDA_mem = (IDAMem)pdata->ida_mem;

  /* Initialize ytemp and yptemp. */
  N_VScale(ONE, yy, ytemp);
  N_VScale(ONE, yp, yptemp);

  /* Obtain pointers as required to the data array of vectors. */
  ydata     = N_VGetArrayPointer(yy);
  ypdata    = N_VGetArrayPointer(yp);
  gtempdata = N_VGetArrayPointer(gtemp);
  ewtdata   = N_VGetArrayPointer(IDA_mem->ida_ewt);
  if (IDA_mem->ida_constraintsSet)
  {
    cnsdata = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }
  ytempdata  = N_VGetArrayPointer(ytemp);
  yptempdata = N_VGetArrayPointer(yptemp);
  grefdata   = N_VGetArrayPointer(gref);

  /* Call gcomm and glocal to get base value of G(t,y,y'). */
  if (pdata->gcomm != NULL)
  {
    retval = pdata->gcomm(pdata->n_local, tt, yy, yp, IDA_mem->ida_user_data);
    if (retval != 0) { return (retval); }
  }

  retval = pdata->glocal(pdata->n_local, tt, yy, yp, gref,
                         IDA_mem->ida_user_data);
  pdata->nge++;
  if (retval != 0) { return (retval); }

  /* Set bandwidth and number of column groups for band differencing. */
  width   = pdata->mldq + pdata->mudq + 1;
  ngroups = SUNMIN(width, pdata->n_local);

  /* Loop over groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Loop over the components in this group. */
    for (j = group - 1; j < pdata->n_local; j += width)
    {
      yj   = ydata[j];
      ypj  = ypdata[j];
      ewtj = ewtdata[j];

      /* Set increment inc to yj based on rel_yy*abs(yj), with
         adjustments using ypj and ewtj if this is small, and a further
         adjustment to give it the same sign as hh*ypj. */
      inc = pdata->rel_yy *
            SUNMAX(SUNRabs(yj),
                   SUNMAX(SUNRabs(IDA_mem->ida_hh * ypj), ONE / ewtj));
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;

      /* Adjust sign(inc) again if yj has an inequality constraint. */
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cnsdata[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Increment yj and ypj. */
      ytempdata[j] += inc;
      yptempdata[j] += cj * inc;
    }

    /* Evaluate G with incremented y and yp arguments. */
    retval = pdata->glocal(pdata->n_local, tt, ytemp, yptemp, gtemp,
                           IDA_mem->ida_user_data);
    pdata->nge++;
    if (retval != 0) { return (retval); }

    /* Loop over components of the group again; restore ytemp and yptemp. */
    for (j = group - 1; j < pdata->n_local; j += width)
    {
      yj = ytempdata[j] = ydata[j];
      ypj = yptempdata[j] = ypdata[j];
      ewtj                = ewtdata[j];

      /* Set increment inc as before .*/
      inc = pdata->rel_yy *
            SUNMAX(SUNRabs(yj),
                   SUNMAX(SUNRabs(IDA_mem->ida_hh * ypj), ONE / ewtj));
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cnsdata[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Form difference quotients and load into PP. */
      inc_inv = ONE / inc;
      col_j   = SUNBandMatrix_Column(pdata->PP, j);
      i1      = SUNMAX(0, j - pdata->mukeep);
      i2      = SUNMIN(j + pdata->mlkeep, pdata->n_local - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (gtempdata[i] - grefdata[i]);
      }
    }
  }

  return (0);
}